

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncomingMessage.cpp
# Opt level: O0

bool __thiscall DIS::IncomingMessage::AddPduBank(IncomingMessage *this,uchar id,IPduBank *pduBank)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPduBank_*>_> local_40;
  iterator containerIter;
  value_type candidate;
  IPduBank *pduBank_local;
  IncomingMessage *pIStack_18;
  uchar id_local;
  IncomingMessage *this_local;
  
  candidate.second = pduBank;
  pduBank_local._7_1_ = id;
  pIStack_18 = this;
  std::pair<const_unsigned_char,_DIS::IPduBank_*>::pair<unsigned_char_&,_DIS::IPduBank_*&,_true>
            ((pair<const_unsigned_char,_DIS::IPduBank_*> *)&containerIter,
             (uchar *)((long)&pduBank_local + 7),&candidate.second);
  std::_Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPduBank_*>_>::_Rb_tree_iterator
            (&local_40);
  bVar1 = FindPduBankContainer(this,pduBank_local._7_1_,candidate.second,&local_40);
  if (!bVar1) {
    std::
    multimap<unsigned_char,DIS::IPduBank*,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,DIS::IPduBank*>>>
    ::insert<std::pair<unsigned_char_const,DIS::IPduBank*>&>
              ((multimap<unsigned_char,DIS::IPduBank*,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,DIS::IPduBank*>>>
                *)&this->_pduBanks,(pair<const_unsigned_char,_DIS::IPduBank_*> *)&containerIter);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool IncomingMessage::AddPduBank(unsigned char id, IPduBank* pduBank)
{
   PduBankContainer::value_type candidate(id,pduBank);
   PduBankContainer::iterator containerIter;

   // If this id doesn't already have this PDU bank (it shouldn't)
   if (!FindPduBankContainer(id, pduBank, containerIter))
   {
       _pduBanks.insert( candidate );
       return true;
   }

   return false;    
}